

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_crl.cc
# Opt level: O0

int crl_inf_cb(int operation,ASN1_VALUE **pval,ASN1_ITEM *it,void *exarg)

{
  ASN1_VALUE *pAVar1;
  X509_CRL_INFO *a;
  void *exarg_local;
  ASN1_ITEM *it_local;
  ASN1_VALUE **pval_local;
  int operation_local;
  
  pAVar1 = *pval;
  if (((pAVar1 != (ASN1_VALUE *)0x0) && (*(long *)(pAVar1 + 0x28) != 0)) && (operation == 5)) {
    sk_X509_REVOKED_set_cmp_func(*(stack_st_X509_REVOKED **)(pAVar1 + 0x28),X509_REVOKED_cmp);
  }
  return 1;
}

Assistant:

static int crl_inf_cb(int operation, ASN1_VALUE **pval, const ASN1_ITEM *it,
                      void *exarg) {
  X509_CRL_INFO *a = (X509_CRL_INFO *)*pval;

  if (!a || !a->revoked) {
    return 1;
  }
  switch (operation) {
      // Just set cmp function here. We don't sort because that would
      // affect the output of X509_CRL_print().
    case ASN1_OP_D2I_POST:
      (void)sk_X509_REVOKED_set_cmp_func(a->revoked, X509_REVOKED_cmp);
      break;
  }
  return 1;
}